

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O0

bool __thiscall DAnimatedDoor::StartClosing(DAnimatedDoor *this)

{
  sector_t_conflict *sec;
  bool bVar1;
  EMoveResult EVar2;
  FName local_24;
  double local_20;
  double topdist;
  DAnimatedDoor *this_local;
  
  if (((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->touching_thinglist
      == (msecnode_t *)0x0) {
    topdist = (double)this;
    local_20 = secplane_t::fD(&((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.
                               m_Sector)->ceilingplane);
    EVar2 = sector_t::MoveCeiling
                      ((sector_t *)
                       (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2048.0
                       ,this->m_BotDist,0,-1,false);
    if (EVar2 == crushed) {
      this_local._7_1_ = false;
    }
    else {
      sector_t::MoveCeiling
                ((sector_t *)(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                 2048.0,local_20,1);
      this->m_Line1->flags = this->m_Line1->flags | 1;
      this->m_Line2->flags = this->m_Line2->flags | 1;
      bVar1 = FName::operator!=(&this->m_DoorAnim->CloseSound,NAME_None);
      if (bVar1) {
        sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
        FName::FName(&local_24,&this->m_DoorAnim->CloseSound);
        SN_StartSequence((sector_t *)sec,2,&local_24,1);
      }
      this->m_Status = 2;
      this->m_Timer = this->m_Speed;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DAnimatedDoor::StartClosing ()
{
	// CAN DOOR CLOSE?
	if (m_Sector->touching_thinglist != NULL)
	{
		return false;
	}

	double topdist = m_Sector->ceilingplane.fD();
	if (m_Sector->MoveCeiling (2048., m_BotDist, 0, -1, false) == EMoveResult::crushed)
	{
		return false;
	}

	m_Sector->MoveCeiling (2048., topdist, 1);

	m_Line1->flags |= ML_BLOCKING;
	m_Line2->flags |= ML_BLOCKING;
	if (m_DoorAnim->CloseSound != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_CEILING, m_DoorAnim->CloseSound, 1);
	}

	m_Status = Closing;
	m_Timer = m_Speed;
	return true;
}